

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAssociation.cpp
# Opt level: O2

void __thiscall DIS::EntityAssociation::unmarshal(EntityAssociation *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_recordType);
  DataStream::operator>>(dataStream,&this->_changeIndicator);
  DataStream::operator>>(dataStream,&this->_associationStatus);
  DataStream::operator>>(dataStream,&this->_associationType);
  EntityID::unmarshal(&this->_entityID,dataStream);
  DataStream::operator>>(dataStream,&this->_owsSttionLocation);
  DataStream::operator>>(dataStream,&this->_physicalConnectionType);
  DataStream::operator>>(dataStream,&this->_groupMemberType);
  DataStream::operator>>(dataStream,&this->_groupNumber);
  return;
}

Assistant:

void EntityAssociation::unmarshal(DataStream& dataStream)
{
    dataStream >> _recordType;
    dataStream >> _changeIndicator;
    dataStream >> _associationStatus;
    dataStream >> _associationType;
    _entityID.unmarshal(dataStream);
    dataStream >> _owsSttionLocation;
    dataStream >> _physicalConnectionType;
    dataStream >> _groupMemberType;
    dataStream >> _groupNumber;
}